

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeFirst(BtCursor *pCur,int *pRes)

{
  undefined4 local_1c;
  int rc;
  int *pRes_local;
  BtCursor *pCur_local;
  
  local_1c = moveToRoot(pCur);
  if (local_1c == 0) {
    *pRes = 0;
    local_1c = moveToLeftmost(pCur);
  }
  else if (local_1c == 0x10) {
    *pRes = 1;
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeFirst(BtCursor *pCur, int *pRes){
  int rc;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  rc = moveToRoot(pCur);
  if( rc==SQLITE_OK ){
    assert( pCur->pPage->nCell>0 );
    *pRes = 0;
    rc = moveToLeftmost(pCur);
  }else if( rc==SQLITE_EMPTY ){
    assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
    *pRes = 1;
    rc = SQLITE_OK;
  }
  return rc;
}